

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

void ps_decoder_init(PS_Decoder *ps_decoder,void *decoder,FT_Bool is_t1)

{
  CFF_Font_conflict pCVar1;
  undefined7 in_register_00000011;
  T1_Decoder_conflict t1_decoder;
  
  memset(ps_decoder,0,0x4f0);
  if ((int)CONCAT71(in_register_00000011,is_t1) == 0) {
    ps_builder_init(&ps_decoder->builder,decoder,'\0');
    pCVar1 = *(CFF_Font_conflict *)((long)decoder + 0xd8);
    ps_decoder->cff = pCVar1;
    ps_decoder->cf2_instance = &pCVar1->cf2_instance;
    ps_decoder->current_subfont = *(CFF_SubFont *)((long)decoder + 0x5d8);
    ps_decoder->num_globals = *(FT_UInt *)((long)decoder + 0x5a4);
    ps_decoder->globals = *(FT_Byte ***)((long)decoder + 0x5b8);
    ps_decoder->globals_bias = *(FT_Int *)((long)decoder + 0x5ac);
    ps_decoder->num_locals = *(FT_UInt *)((long)decoder + 0x5a0);
    ps_decoder->locals = *(FT_Byte ***)((long)decoder + 0x5b0);
    ps_decoder->locals_bias = *(FT_Int *)((long)decoder + 0x5a8);
    ps_decoder->glyph_width = (FT_Pos *)((long)decoder + 0x488);
    ps_decoder->width_only = *(FT_Bool *)((long)decoder + 0x499);
    ps_decoder->hint_mode = *(FT_Render_Mode *)((long)decoder + 0x5cc);
    ps_decoder->get_glyph_callback = *(CFF_Decoder_Get_Glyph_Callback *)((long)decoder + 0x5e0);
    ps_decoder->free_glyph_callback = *(CFF_Decoder_Free_Glyph_Callback *)((long)decoder + 0x5e8);
  }
  else {
    ps_builder_init(&ps_decoder->builder,decoder,is_t1);
    ps_decoder->cf2_instance = (FT_Generic *)((long)decoder + 0xba8);
    ps_decoder->psnames = *(FT_Service_PsCMaps *)((long)decoder + 0xa80);
    ps_decoder->num_glyphs = *(FT_UInt *)((long)decoder + 0xa88);
    ps_decoder->glyph_names = *(FT_Byte ***)((long)decoder + 0xa90);
    ps_decoder->hint_mode = *(FT_Render_Mode *)((long)decoder + 0xb68);
    ps_decoder->blend = *(PS_Blend *)((long)decoder + 0xb60);
    ps_decoder->num_locals = *(FT_UInt *)((long)decoder + 0xa9c);
    ps_decoder->locals = *(FT_Byte ***)((long)decoder + 0xaa0);
    ps_decoder->locals_len = *(FT_UInt **)((long)decoder + 0xaa8);
    ps_decoder->locals_hash = *(FT_Hash *)((long)decoder + 0xab0);
    ps_decoder->buildchar = *(FT_Long **)((long)decoder + 0xb98);
    ps_decoder->len_buildchar = *(FT_UInt *)((long)decoder + 0xba0);
    ps_decoder->lenIV = *(FT_Int *)((long)decoder + 0xa98);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_decoder_init( PS_Decoder*  ps_decoder,
                   void*        decoder,
                   FT_Bool      is_t1 )
  {
    FT_ZERO( ps_decoder );

    if ( is_t1 )
    {
      T1_Decoder  t1_decoder = (T1_Decoder)decoder;


      ps_builder_init( &ps_decoder->builder,
                       &t1_decoder->builder,
                       is_t1 );

      ps_decoder->cf2_instance = &t1_decoder->cf2_instance;
      ps_decoder->psnames      = t1_decoder->psnames;

      ps_decoder->num_glyphs  = t1_decoder->num_glyphs;
      ps_decoder->glyph_names = t1_decoder->glyph_names;
      ps_decoder->hint_mode   = t1_decoder->hint_mode;
      ps_decoder->blend       = t1_decoder->blend;

      ps_decoder->num_locals  = (FT_UInt)t1_decoder->num_subrs;
      ps_decoder->locals      = t1_decoder->subrs;
      ps_decoder->locals_len  = t1_decoder->subrs_len;
      ps_decoder->locals_hash = t1_decoder->subrs_hash;

      ps_decoder->buildchar     = t1_decoder->buildchar;
      ps_decoder->len_buildchar = t1_decoder->len_buildchar;

      ps_decoder->lenIV = t1_decoder->lenIV;
    }
    else
    {
      CFF_Decoder*  cff_decoder = (CFF_Decoder*)decoder;


      ps_builder_init( &ps_decoder->builder,
                       &cff_decoder->builder,
                       is_t1 );

      ps_decoder->cff             = cff_decoder->cff;
      ps_decoder->cf2_instance    = &cff_decoder->cff->cf2_instance;
      ps_decoder->current_subfont = cff_decoder->current_subfont;

      ps_decoder->num_globals  = cff_decoder->num_globals;
      ps_decoder->globals      = cff_decoder->globals;
      ps_decoder->globals_bias = cff_decoder->globals_bias;
      ps_decoder->num_locals   = cff_decoder->num_locals;
      ps_decoder->locals       = cff_decoder->locals;
      ps_decoder->locals_bias  = cff_decoder->locals_bias;

      ps_decoder->glyph_width   = &cff_decoder->glyph_width;
      ps_decoder->width_only    = cff_decoder->width_only;

      ps_decoder->hint_mode = cff_decoder->hint_mode;

      ps_decoder->get_glyph_callback  = cff_decoder->get_glyph_callback;
      ps_decoder->free_glyph_callback = cff_decoder->free_glyph_callback;
    }
  }